

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

DBKeyID __thiscall
anon_unknown.dwarf_44de67::SQLiteBuildDB::getKeyID
          (SQLiteBuildDB *this,KeyID keyID,string *error_out)

{
  int iVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  iterator iVar4;
  KeyID keyID_local;
  DBKeyID local_68;
  string local_60;
  KeyType key;
  
  keyID_local = keyID;
  iVar4 = llvm::
          DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
          ::find((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                  *)&this->dbKeyIDs,&keyID_local);
  if (iVar4.Ptr != (this->dbKeyIDs).Buckets + (this->dbKeyIDs).NumBuckets) {
    return (DBKeyID)((iVar4.Ptr)->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value;
  }
  (*this->delegate->_vptr_BuildDBDelegate[3])(&key,this->delegate,keyID_local._value);
  iVar1 = sqlite3_reset(this->findKeyIDForKeyStmt);
  if (((iVar1 == 0) && (iVar1 = sqlite3_clear_bindings(this->findKeyIDForKeyStmt), iVar1 == 0)) &&
     (iVar1 = sqlite3_bind_text(this->findKeyIDForKeyStmt,1,key.key._M_dataplus._M_p,
                                (undefined4)key.key._M_string_length,0), iVar1 == 0)) {
    iVar1 = sqlite3_step(this->findKeyIDForKeyStmt);
    if (iVar1 == 100) {
      iVar1 = sqlite3_column_count(this->findKeyIDForKeyStmt);
      if (iVar1 != 1) {
        __assert_fail("sqlite3_column_count(findKeyIDForKeyStmt) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                      ,0x398,
                      "DBKeyID (anonymous namespace)::SQLiteBuildDB::getKeyIDFromDB(KeyID, std::string *)"
                     );
      }
      local_68.value = sqlite3_column_int64(this->findKeyIDForKeyStmt,0);
      goto LAB_001b0f3e;
    }
    iVar1 = sqlite3_reset(this->insertIntoKeysStmt);
    if (((iVar1 == 0) && (iVar1 = sqlite3_clear_bindings(this->insertIntoKeysStmt), iVar1 == 0)) &&
       ((iVar1 = sqlite3_bind_text(this->insertIntoKeysStmt,1,key.key._M_dataplus._M_p,
                                   (undefined4)key.key._M_string_length,0), iVar1 == 0 &&
        (iVar1 = sqlite3_step(this->insertIntoKeysStmt), iVar1 == 0x65)))) {
      local_68.value = sqlite3_last_insert_rowid(this->db);
      goto LAB_001b0f3e;
    }
  }
  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_60,this);
  std::__cxx11::string::operator=((string *)error_out,(string *)&local_60);
  std::__cxx11::string::_M_dispose();
  local_68.value = 0;
LAB_001b0f3e:
  std::__cxx11::string::_M_dispose();
  if (local_68.value == 0) {
    local_68.value = 0;
  }
  else {
    pvVar2 = llvm::
             DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
             ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                 *)&this->engineKeyIDs,&local_68);
    (pvVar2->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = keyID_local._value;
    pvVar3 = llvm::
             DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
             ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                 *)&this->dbKeyIDs,&keyID_local);
    (pvVar3->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_68.value;
  }
  return (DBKeyID)local_68.value;
}

Assistant:

DBKeyID getKeyID(KeyID keyID, std::string *error_out) {
    // Try to fetch the DBKeyID from the cache
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      return it->second;
    }

    auto dbKeyID = getKeyIDFromDB(keyID, error_out);

    if (dbKeyID.value != 0) {
      // Cache the ID mappings
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;
    }

    return dbKeyID;
  }